

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall
cmCTestCoverageHandler::FindGCovFiles
          (cmCTestCoverageHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  _Base_ptr p_Var4;
  char *local_220 [4];
  Glob gl;
  string daGlob;
  
  cmsys::Glob::Glob(&gl);
  gl.Recurse = true;
  gl.RecurseThroughSymlinks = false;
  for (p_Var4 = (this->TargetDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->TargetDirs)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    bVar1 = IntersectsFilter(this,(LabelSet *)(p_Var4 + 2));
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&daGlob);
      poVar2 = std::operator<<((ostream *)&daGlob,"   globbing for coverage in: ");
      poVar2 = std::operator<<(poVar2,(string *)(p_Var4 + 1));
      std::endl<char,std::char_traits<char>>(poVar2);
      this_00 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_00,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x63f,local_220[0],(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)local_220);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&daGlob);
      std::__cxx11::string::string((string *)&daGlob,(string *)(p_Var4 + 1));
      std::__cxx11::string::append((char *)&daGlob);
      cmsys::Glob::FindFiles(&gl,&daGlob,(GlobMessages *)0x0);
      pvVar3 = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
      cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (files,pvVar3);
      std::__cxx11::string::_M_assign((string *)&daGlob);
      std::__cxx11::string::append((char *)&daGlob);
      cmsys::Glob::FindFiles(&gl,&daGlob,(GlobMessages *)0x0);
      pvVar3 = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
      cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (files,pvVar3);
      std::__cxx11::string::~string((string *)&daGlob);
    }
  }
  cmsys::Glob::~Glob(&gl);
  return;
}

Assistant:

void cmCTestCoverageHandler::FindGCovFiles(std::vector<std::string>& files)
{
  cmsys::Glob gl;
  gl.RecurseOn();
  gl.RecurseThroughSymlinksOff();

  for (auto const& lm : this->TargetDirs) {
    // Skip targets containing no interesting labels.
    if (!this->IntersectsFilter(lm.second)) {
      continue;
    }

    // Coverage files appear next to their object files in the target
    // support directory.
    cmCTestOptionalLog(
      this->CTest, HANDLER_VERBOSE_OUTPUT,
      "   globbing for coverage in: " << lm.first << std::endl, this->Quiet);
    std::string daGlob = lm.first;
    daGlob += "/*.da";
    gl.FindFiles(daGlob);
    cmAppend(files, gl.GetFiles());
    daGlob = lm.first;
    daGlob += "/*.gcda";
    gl.FindFiles(daGlob);
    cmAppend(files, gl.GetFiles());
  }
}